

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerInvisibility::EndEffect(APowerInvisibility *this)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  AInventory *local_30;
  AInventory *item;
  TFlags<ActorFlag3,_unsigned_int> local_20;
  TFlags<ActorFlag3,_unsigned_int> local_1c;
  TFlags<ActorFlag,_unsigned_int> local_18;
  TFlags<ActorFlag,_unsigned_int> local_14;
  APowerInvisibility *local_10;
  APowerInvisibility *this_local;
  
  local_10 = this;
  APowerup::EndEffect(&this->super_APowerup);
  bVar2 = TObjPtr<AActor>::operator!=(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if (bVar2) {
    iVar1 = (int)this;
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_18,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    TFlags<ActorFlag,_unsigned_int>::operator~(&local_14);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&pAVar3->flags,&local_14);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_20,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    TFlags<ActorFlag3,_unsigned_int>::operator~(&local_1c);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag3,_unsigned_int>::operator&=(&pAVar3->flags3,&local_1c);
    TFlags<ActorFlag5,_unsigned_int>::operator&
              ((TFlags<ActorFlag5,_unsigned_int> *)&item,
               iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
    TFlags<ActorFlag5,_unsigned_int>::operator~
              ((TFlags<ActorFlag5,_unsigned_int> *)((long)&item + 4));
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag5,_unsigned_int>::operator&=(&pAVar3->flags5,(Self *)((long)&item + 4));
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    FRenderStyle::operator=((FRenderStyle *)&(pAVar3->RenderStyle).field_0,STYLE_Normal);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    pAVar3->Alpha = 1.0;
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    for (local_30 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&pAVar3->Inventory);
        local_30 != (AInventory *)0x0;
        local_30 = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)&(local_30->super_AActor).Inventory)) {
      bVar2 = DObject::IsKindOf((DObject *)local_30,RegistrationInfo.MyClass);
      if ((bVar2) && (local_30 != (AInventory *)this)) {
        (*(local_30->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])();
      }
    }
  }
  return;
}

Assistant:

void APowerInvisibility::EndEffect ()
{
	Super::EndEffect();
	if (Owner != NULL)
	{
		Owner->flags  &= ~(flags  & INVISIBILITY_FLAGS1);
		Owner->flags3 &= ~(flags3 & INVISIBILITY_FLAGS3);
		Owner->flags5 &= ~(flags5 & INVISIBILITY_FLAGS5);

		Owner->RenderStyle = STYLE_Normal;
		Owner->Alpha = 1.;

		// Check whether there are other invisibility items and refresh their effect.
		// If this isn't done there will be one incorrectly drawn frame when this
		// item expires.
		AInventory *item = Owner->Inventory;
		while (item != NULL)
		{
			if (item->IsKindOf(RUNTIME_CLASS(APowerInvisibility)) && item != this)
			{
				static_cast<APowerInvisibility*>(item)->DoEffect();
			}
			item = item->Inventory;
		}
	}
}